

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O3

void RigidBodyDynamics::CalcContactJacobian
               (Model *model,VectorNd *Q,ConstraintSet *CS,MatrixNd *G,bool update_kinematics)

{
  long lVar1;
  uint body_id;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  double *pdVar5;
  ActualDstType actualDst;
  double *pdVar6;
  double *pdVar7;
  undefined7 in_register_00000081;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  MatrixNd Gi;
  DenseStorage<double,__1,__1,__1,_0> local_68;
  VectorNd *local_50;
  MatrixNd *local_48;
  undefined1 *local_40;
  undefined1 local_38 [8];
  
  local_50 = Q;
  local_48 = G;
  if ((int)CONCAT71(in_register_00000081,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  local_68.m_data = (double *)0x0;
  local_68.m_rows = 0;
  local_68.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_68,(ulong)model->dof_count * 3,3,(ulong)model->dof_count);
  if (*(long *)(CS + 0x70) != 0) {
    lVar2 = *(long *)(CS + 0x20);
    uVar8 = 0;
    dVar11 = 0.0;
    dVar9 = 0.0;
    dVar10 = 0.0;
    uVar3 = 0;
    do {
      body_id = *(uint *)(lVar2 + uVar8 * 4);
      if (uVar3 == body_id) {
        pdVar5 = (double *)(*(long *)(CS + 0x38) + uVar8 * 0x18);
        if ((dVar9 != *pdVar5) || (NAN(dVar9) || NAN(*pdVar5))) goto LAB_00110ff6;
        lVar1 = *(long *)(CS + 0x38) + uVar8 * 0x18;
        pdVar5 = (double *)(lVar1 + 8);
        if ((dVar10 != *pdVar5) || (NAN(dVar10) || NAN(*pdVar5))) goto LAB_00110ff6;
        pdVar5 = (double *)(lVar1 + 0x10);
        if ((dVar11 != *pdVar5) || (NAN(dVar11) || NAN(*pdVar5))) goto LAB_00110ff6;
      }
      else {
LAB_00110ff6:
        if (0 < local_68.m_cols * local_68.m_rows) {
          memset(local_68.m_data,0,local_68.m_cols * local_68.m_rows * 8);
        }
        CalcPointJacobian(model,local_50,body_id,(Vector3d *)(uVar8 * 0x18 + *(long *)(CS + 0x38)),
                          (MatrixNd *)&local_68,false);
        lVar2 = *(long *)(CS + 0x20);
        uVar3 = *(uint *)(lVar2 + uVar8 * 4);
        pdVar5 = (double *)(*(long *)(CS + 0x38) + uVar8 * 0x18);
        dVar9 = *pdVar5;
        dVar10 = pdVar5[1];
        dVar11 = *(double *)(*(long *)(CS + 0x38) + 0x10 + uVar8 * 0x18);
      }
      uVar4 = (ulong)model->dof_count;
      if (uVar4 != 0) {
        pdVar5 = (double *)(uVar8 * 0x18 + *(long *)(CS + 0x50));
        lVar1 = (local_48->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        pdVar7 = local_68.m_data + 2;
        pdVar6 = (local_48->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data + uVar8;
        do {
          *pdVar6 = *pdVar7 * pdVar5[2] + pdVar5[1] * pdVar7[-1] + *pdVar5 * pdVar7[-2];
          pdVar7 = pdVar7 + local_68.m_rows;
          pdVar6 = pdVar6 + lVar1;
          uVar4 = uVar4 - 1;
          local_40 = local_38;
        } while (uVar4 != 0);
      }
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar8 < *(ulong *)(CS + 0x70));
  }
  free(local_68.m_data);
  return;
}

Assistant:

RBDL_DLLAPI
void CalcContactJacobian(
		Model &model,
		const Math::VectorNd &Q,
		const ConstraintSet &CS,
		Math::MatrixNd &G,
		bool update_kinematics
		) {
	if (update_kinematics)
		UpdateKinematicsCustom (model, &Q, NULL, NULL);

	unsigned int i,j;

	// variables to check whether we need to recompute G
	unsigned int prev_body_id = 0;
	Vector3d prev_body_point = Vector3d::Zero();
	MatrixNd Gi (3, model.dof_count);

	for (i = 0; i < CS.size(); i++) {
		// only compute the matrix Gi if actually needed
		if (prev_body_id != CS.body[i] || prev_body_point != CS.point[i]) {
			Gi.setZero();
			CalcPointJacobian (model, Q, CS.body[i], CS.point[i], Gi, false);
			prev_body_id = CS.body[i];
			prev_body_point = CS.point[i];
		}

		for (j = 0; j < model.dof_count; j++) {
			Vector3d gaxis (Gi(0,j), Gi(1,j), Gi(2,j));
			G(i,j) = gaxis.transpose() * CS.normal[i];
		}
	}
}